

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reservoir_sample.cpp
# Opt level: O2

void __thiscall
duckdb::ReservoirSamplePercentage::ReservoirSamplePercentage
          (ReservoirSamplePercentage *this,double percentage,int64_t seed,
          idx_t reservoir_sample_size)

{
  _Head_base<0UL,_duckdb::ReservoirSample_*,_false> _Var1;
  _Head_base<0UL,_duckdb::ReservoirSample_*,_false> _Var2;
  Allocator *args;
  pointer this_00;
  _Head_base<0UL,_duckdb::ReservoirSample_*,_false> local_40;
  double local_38;
  idx_t local_30;
  uint32_t local_24;
  
  local_38 = percentage;
  local_30 = reservoir_sample_size;
  BlockingSample::BlockingSample(&this->super_BlockingSample,seed);
  (this->super_BlockingSample)._vptr_BlockingSample =
       (_func_int **)&PTR__ReservoirSamplePercentage_027b8390;
  args = Allocator::DefaultAllocator();
  this->allocator = args;
  this->sample_percentage = local_38 / 100.0;
  this->reservoir_sample_size = reservoir_sample_size;
  (this->current_sample).
  super_unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>_>._M_t.
  super___uniq_ptr_impl<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::ReservoirSample_*,_std::default_delete<duckdb::ReservoirSample>_>.
  super__Head_base<0UL,_duckdb::ReservoirSample_*,_false>._M_head_impl = (ReservoirSample *)0x0;
  (this->finished_samples).
  super_vector<duckdb::unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->finished_samples).
  super_vector<duckdb::unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->finished_samples).
  super_vector<duckdb::unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->finished_samples).
           super_vector<duckdb::unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  *(undefined8 *)((long)&this->current_count + 1) = 0;
  this_00 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
            ::operator->(&(this->super_BlockingSample).base_reservoir_sample);
  local_24 = RandomEngine::NextRandomInteger((RandomEngine *)this_00);
  make_uniq<duckdb::ReservoirSample,duckdb::Allocator&,unsigned_long&,unsigned_int>
            ((duckdb *)&local_40,args,&local_30,&local_24);
  _Var2._M_head_impl = local_40._M_head_impl;
  local_40._M_head_impl = (ReservoirSample *)0x0;
  _Var1._M_head_impl =
       (this->current_sample).
       super_unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>_>._M_t
       .
       super___uniq_ptr_impl<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ReservoirSample_*,_std::default_delete<duckdb::ReservoirSample>_>
       .super__Head_base<0UL,_duckdb::ReservoirSample_*,_false>._M_head_impl;
  (this->current_sample).
  super_unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>_>._M_t.
  super___uniq_ptr_impl<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::ReservoirSample_*,_std::default_delete<duckdb::ReservoirSample>_>.
  super__Head_base<0UL,_duckdb::ReservoirSample_*,_false>._M_head_impl = _Var2._M_head_impl;
  if (_Var1._M_head_impl != (ReservoirSample *)0x0) {
    (**(code **)(*(long *)&(_Var1._M_head_impl)->super_BlockingSample + 8))();
    if (local_40._M_head_impl != (ReservoirSample *)0x0) {
      (**(code **)(*(long *)local_40._M_head_impl + 8))();
    }
  }
  (this->super_BlockingSample).type = RESERVOIR_PERCENTAGE_SAMPLE;
  return;
}

Assistant:

ReservoirSamplePercentage::ReservoirSamplePercentage(double percentage, int64_t seed, idx_t reservoir_sample_size)
    : BlockingSample(seed), allocator(Allocator::DefaultAllocator()), sample_percentage(percentage / 100.0),
      reservoir_sample_size(reservoir_sample_size), current_count(0), is_finalized(false) {
	current_sample = make_uniq<ReservoirSample>(allocator, reservoir_sample_size, base_reservoir_sample->random());
	type = SampleType::RESERVOIR_PERCENTAGE_SAMPLE;
}